

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>
::basic_msgpack_parser<std::istream&>
          (basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,basic_istream<char,_std::char_traits<char>_> *source,msgpack_decode_options *options,
          allocator<char> *alloc)

{
  stream_source<unsigned_char> *in_RCX;
  ser_context *in_RDI;
  allocator<char> *__a;
  msgpack_decode_options *in_stack_ffffffffffffff90;
  string *this_00;
  ser_context *__args;
  vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_> *this_01;
  size_t in_stack_ffffffffffffffd0;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd8;
  
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_msgpack_parser_01332cd8;
  *(undefined1 *)&in_RDI[1]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 1) = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ser_context + 4) = 0;
  *(undefined1 *)&in_RDI[2]._vptr_ser_context = 0;
  *(undefined4 *)((long)&in_RDI[2]._vptr_ser_context + 4) = 0;
  stream_source<unsigned_char>::stream_source
            (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  __a = (allocator<char> *)(in_RDI + 0x36);
  msgpack_decode_options::msgpack_decode_options
            (in_stack_ffffffffffffff90,(msgpack_decode_options *)__a);
  this_00 = (string *)(in_RDI + 0x39);
  std::__cxx11::string::string(this_00,(allocator *)in_RCX);
  __args = in_RDI + 0x3d;
  this_01 = (vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
             *)&stack0xffffffffffffffd3;
  std::allocator<unsigned_char>::allocator<char>((allocator<unsigned_char> *)this_00,__a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(allocator_type *)__a)
  ;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x959eac);
  std::allocator<jsoncons::msgpack::parse_state>::allocator<char>
            ((allocator<jsoncons::msgpack::parse_state> *)this_00,__a);
  std::vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>::
  vector((vector<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_> *)
         this_00,(allocator_type *)__a);
  std::allocator<jsoncons::msgpack::parse_state>::~allocator
            ((allocator<jsoncons::msgpack::parse_state> *)0x959ee9);
  std::vector<jsoncons::msgpack::parse_state,std::allocator<jsoncons::msgpack::parse_state>>::
  emplace_back<jsoncons::msgpack::parse_mode,int>(this_01,(parse_mode *)__args,(int *)this_00);
  return;
}

Assistant:

basic_msgpack_parser(Sourceable&& source,
                         const msgpack_decode_options& options = msgpack_decode_options(),
                         const Allocator& alloc = Allocator())
       : source_(std::forward<Sourceable>(source)),
         options_(options),
         text_buffer_(alloc),
         bytes_buffer_(alloc),
         state_stack_(alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0);
    }